

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
* __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::next(FastGeneralizationsIterator *this)

{
  bool bVar1;
  byte *in_RSI;
  GenMatcher *in_RDI;
  SmartPtr<Indexing::ResultSubstitution> *pSVar2;
  FastGeneralizationsIterator *in_stack_00000018;
  Lhs *ld;
  Renaming *in_stack_ffffffffffffff80;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_ffffffffffffff88;
  Renaming *in_stack_ffffffffffffff90;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
  *this_00;
  bool local_61;
  GenMatcher *this_01;
  SmartPtr<Indexing::ResultSubstitution> local_48 [2];
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
  local_28;
  
  this_01 = in_RDI;
  do {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x443de9)
    ;
    local_61 = false;
    if (!bVar1) {
      local_61 = findNextLeaf(in_stack_00000018);
    }
  } while (local_61 != false);
  local_28.data =
       Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::next
                 ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x443e1e);
  if ((*in_RSI & 1) == 0) {
    pSVar2 = local_48;
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(pSVar2);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
    ::QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
                *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(Lhs *)pSVar2);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(pSVar2);
  }
  else {
    pSVar2 = (SmartPtr<Indexing::ResultSubstitution> *)(in_RSI + 0x70);
    Kernel::Renaming::reset(in_stack_ffffffffffffff80);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::key((Lhs *)0x443e51);
    Kernel::Renaming::normalizeVariables(in_stack_ffffffffffffff90,(Literal *)pSVar2);
    this_00 = &local_28;
    SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::getSubstitution
              (this_01,(Renaming *)in_RDI);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
    ::QueryRes(this_00,pSVar2,(Lhs *)in_stack_ffffffffffffff80);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff80);
  }
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
          *)this_01;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastGeneralizationsIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultNormalizer.reset();
    _resultNormalizer.normalizeVariables(ld->key());

    return QueryRes(_subst.getSubstitution(&_resultNormalizer),ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}